

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O0

void Abc_NodeCovDropData(Cov_Man_t *p,Abc_Obj_t *pObj)

{
  Min_Man_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  Min_Cube_t *pCover;
  int nFanouts;
  Abc_Obj_t *pObj_local;
  Cov_Man_t *p_local;
  
  if (p->vFanCounts == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x81,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar1 = Vec_IntEntry(p->vFanCounts,pObj->Id);
  if (0 < iVar1) {
    if (iVar1 + -1 == 0) {
      p_01 = Abc_ObjGetSupp(pObj);
      Vec_IntFree(p_01);
      Abc_ObjSetSupp(pObj,(Vec_Int_t *)0x0);
      p_00 = p->pManMin;
      pCover = Abc_ObjGetCover2(pObj);
      Min_CoverRecycle(p_00,pCover);
      Abc_ObjSetCover2(pObj,(Min_Cube_t *)0x0);
      p->nSupps = p->nSupps + -1;
    }
    Vec_IntWriteEntry(p->vFanCounts,pObj->Id,iVar1 + -1);
    return;
  }
  __assert_fail("nFanouts > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                ,0x83,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_NodeCovDropData( Cov_Man_t * p, Abc_Obj_t * pObj )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, pObj->Id );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
    {
        Vec_IntFree( Abc_ObjGetSupp(pObj) );
        Abc_ObjSetSupp( pObj, NULL );
        Min_CoverRecycle( p->pManMin, Abc_ObjGetCover2(pObj) );
        Abc_ObjSetCover2( pObj, NULL );
        p->nSupps--;
    }
    Vec_IntWriteEntry( p->vFanCounts, pObj->Id, nFanouts );
}